

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

Node * CleanNode(TidyDocImpl *doc,Node *node)

{
  ulong uVar1;
  ulong uVar2;
  Bool BVar3;
  TidyTriState mergeSpans;
  TidyTriState mergeDivs;
  Node *next;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  uVar1 = (doc->config).value[0x58].v;
  uVar2 = (doc->config).value[0x5c].v;
  next = node;
  node_local = &doc->root;
  do {
    _mergeSpans = next;
    BVar3 = prvTidynodeIsElement(next);
    if (BVar3 == no) {
      return _mergeSpans;
    }
    BVar3 = Dir2Div((TidyDocImpl *)node_local,next,(Node **)&mergeSpans);
    if (BVar3 == no) {
      BVar3 = NestedList((TidyDocImpl *)node_local,next,(Node **)&mergeSpans);
      if (BVar3 != no) {
        return _mergeSpans;
      }
      BVar3 = Center2Div((TidyDocImpl *)node_local,next,(Node **)&mergeSpans);
      if ((((BVar3 == no) &&
           (BVar3 = MergeNestedElements((TidyDocImpl *)node_local,TidyTag_DIV,(TidyTriState)uVar1,
                                        next,(Node **)&mergeSpans), BVar3 == no)) &&
          (BVar3 = MergeNestedElements((TidyDocImpl *)node_local,TidyTag_SPAN,(TidyTriState)uVar2,
                                       next,(Node **)&mergeSpans), BVar3 == no)) &&
         (((BVar3 = BlockStyle((TidyDocImpl *)node_local,next,(Node **)&mergeSpans), BVar3 == no &&
           (BVar3 = InlineStyle((TidyDocImpl *)node_local,next,(Node **)&mergeSpans), BVar3 == no))
          && ((BVar3 = InlineElementToCSS((TidyDocImpl *)node_local,next,(Node **)&mergeSpans),
              BVar3 == no &&
              (BVar3 = Font2Span((TidyDocImpl *)node_local,next,(Node **)&mergeSpans), BVar3 == no))
             )))) {
        return _mergeSpans;
      }
    }
    next = _mergeSpans;
  } while( true );
}

Assistant:

Node* CleanNode( TidyDocImpl* doc, Node *node )
{
    Node *next = NULL;
    TidyTriState mergeDivs = cfgAutoBool(doc, TidyMergeDivs);
    TidyTriState mergeSpans = cfgAutoBool(doc, TidyMergeSpans);

    for (next = node; TY_(nodeIsElement)(node); node = next)
    {
        if ( Dir2Div(doc, node, &next) )
            continue;

        /* Special case: true result means
        ** that arg node and its parent no longer exist.
        ** So we must jump back up the CreateStyleProperties()
        ** call stack until we have a valid node reference.
        */
        if ( NestedList(doc, node, &next) )
            return next;

        if ( Center2Div(doc, node, &next) )
            continue;

        if ( MergeNestedElements(doc, TidyTag_DIV, mergeDivs, node, &next) )
            continue;

        if ( MergeNestedElements(doc, TidyTag_SPAN, mergeSpans, node, &next) )
            continue;

        if ( BlockStyle(doc, node, &next) )
            continue;

        if ( InlineStyle(doc, node, &next) )
            continue;

        if ( InlineElementToCSS(doc, node, &next) )
            continue;

        if ( Font2Span(doc, node, &next) )
            continue;

        break;
    }

    return next;
}